

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

void __thiscall calculator::Lexer::scan(Lexer *this)

{
  Reader *this_00;
  int *piVar1;
  pointer psVar2;
  shared_ptr<calculator::Number> *psVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  char cVar7;
  pair<bool,_char> pVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  Token *pTVar12;
  Function *this_01;
  long lVar13;
  iterator iVar14;
  iterator iVar15;
  _Elt_pointer pbVar16;
  BinaryFunction *this_02;
  Float *pFVar17;
  Number *pNVar18;
  Word *this_03;
  __shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2> *this_04;
  SyntaxError *pSVar19;
  ZeroNumberException *this_05;
  HexBinOctException *pHVar20;
  FunctionNotDefined *this_06;
  ulong unaff_R15;
  bool bVar21;
  double dVar22;
  string str;
  shared_ptr<calculator::Token> word;
  shared_ptr<calculator::Number> num;
  
  this_00 = &this->reader_;
LAB_0010ad42:
  if ((this->reader_).ptr_ < (this->reader_).len_) {
    bVar4 = Reader::get(this_00);
    unaff_R15 = (ulong)bVar4;
    uVar11 = (ulong)bVar4;
    if (bVar4 < 0x2e) goto code_r0x0010ad62;
    goto LAB_0010adac;
  }
  goto LAB_0010adb7;
code_r0x0010ad62:
  if ((0x100000a01U >> (uVar11 & 0x3f) & 1) == 0) {
    if (uVar11 != 10) {
      if ((0x280000000000U >> (uVar11 & 0x3f) & 1) != 0) goto LAB_0010ad86;
LAB_0010adac:
      if (bVar4 == 0xff) {
        return;
      }
      goto LAB_0010adb7;
    }
    this->line_ = this->line_ + 1;
  }
  goto LAB_0010ad42;
LAB_0010b877:
  uVar10 = (this->reader_).ptr_;
LAB_0010b87d:
  (this->reader_).ptr_ = uVar10 - 1;
  cVar7 = Reader::cur(this_00);
  this->lookforward_ = cVar7;
  pFVar17 = (Float *)operator_new(0x50);
  dVar22 = toAny<double>(&str);
  Float::Float(pFVar17,dVar22);
  std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<calculator::Float,void>
            ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&word,pFVar17);
  std::vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
  ::emplace_back<std::shared_ptr<calculator::Token>>
            ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
              *)&this->tokenlist_,&word);
  goto LAB_0010bb46;
  while ((0x100000a01U >> ((ulong)bVar5 & 0x3f) & 1) != 0) {
LAB_0010ad86:
    bVar5 = Reader::get(this_00);
    if (0x20 < bVar5) break;
  }
  if (bVar4 == bVar5) {
    pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,"can not present continue symbol ++/--",(allocator<char> *)&word);
    SyntaxError::SyntaxError(pSVar19,&str);
    __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
  }
  piVar1 = &(this->reader_).ptr_;
  *piVar1 = *piVar1 + -1;
LAB_0010adb7:
  bVar4 = this->lookforward_;
  if ((((bVar4 == 0x29) || ((bVar4 & 0xdf) == 0x45)) ||
      ((bVar21 = (char)unaff_R15 == '-', !bVar21 && (((uint)unaff_R15 & 0xff) != 0x2b)))) ||
     (((byte)(bVar4 - 0x30) < 10 || (bVar4 == 0x2e || (byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)))) {
    bVar21 = false;
  }
  else {
    do {
      bVar4 = Reader::get(this_00);
      unaff_R15 = (ulong)bVar4;
      if (0x20 < bVar4) break;
    } while ((0x100000a01U >> (unaff_R15 & 0x3f) & 1) != 0);
  }
  bVar4 = (byte)unaff_R15;
  this->lookforward_ = bVar4;
  uVar10 = (uint)unaff_R15 & 0xff;
  switch(uVar10) {
  case 0x21:
    pTVar12 = (Token *)operator_new(0x48);
    Token::Token(pTVar12,Not);
    std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<calculator::Token,void>
              ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
    break;
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2c:
  case 0x2e:
    goto switchD_0010ae1d_caseD_22;
  case 0x25:
    pTVar12 = (Token *)operator_new(0x48);
    Token::Token(pTVar12,Mod);
    std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<calculator::Token,void>
              ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
    break;
  case 0x26:
    pTVar12 = (Token *)operator_new(0x48);
    Token::Token(pTVar12,And);
    std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<calculator::Token,void>
              ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
    break;
  case 0x2a:
    pVar8 = Reader::geteq(this_00,0x2a);
    if (((ushort)pVar8 & 1) == 0) {
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,Mul);
      std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Token,void>
                ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
    }
    else {
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,Pow);
      std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Token,void>
                ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
    }
    break;
  case 0x2b:
    pTVar12 = (Token *)operator_new(0x48);
    Token::Token(pTVar12,Add);
    std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<calculator::Token,void>
              ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
    break;
  case 0x2d:
    if (bVar21 == false) {
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,Sub);
      std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Token,void>
                ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
      break;
    }
    goto switchD_0010ae1d_caseD_22;
  case 0x2f:
    pTVar12 = (Token *)operator_new(0x48);
    Token::Token(pTVar12,Div);
    std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<calculator::Token,void>
              ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
    break;
  case 0x30:
    cVar7 = Reader::peek(this_00);
    if (cVar7 == '.') goto switchD_0010ae1d_caseD_22;
    cVar7 = Reader::peek(this_00);
    if ((byte)(cVar7 - 0x30U) < 10) {
      this_05 = (ZeroNumberException *)__cxa_allocate_exception(0x28);
      cVar7 = Reader::peek(this_00);
      ZeroNumberException::ZeroNumberException(this_05,cVar7 + -0x30);
      __cxa_throw(this_05,&ZeroNumberException::typeinfo,SyntaxError::~SyntaxError);
    }
    cVar7 = Reader::get(this_00);
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    num.super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    num.super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (cVar7 == 'x') {
      while( true ) {
        bVar4 = Reader::get(this_00);
        bVar21 = ishex(bVar4);
        if (!bVar21) break;
        std::__cxx11::string::append((ulong)&str,'\x01');
      }
      if (('F' < (char)bVar4) && ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)) {
        pHVar20 = (HexBinOctException *)__cxa_allocate_exception(0x28);
        word.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&stack0xffffffffffffffa8;
        std::__cxx11::string::_M_construct((ulong)&word,'\x01');
        HexBinOctException::HexBinOctException(pHVar20,(string *)&word);
        __cxa_throw(pHVar20,&HexBinOctException::typeinfo,SyntaxError::~SyntaxError);
      }
      pNVar18 = (Number *)operator_new(0x50);
      lVar13 = toBase<long,16ul>(&str);
      Number::Number(pNVar18,lVar13);
      std::__shared_ptr<calculator::Number,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Number,void>
                ((__shared_ptr<calculator::Number,(__gnu_cxx::_Lock_policy)2> *)&word,pNVar18);
    }
    else if (cVar7 == 'o') {
      while (bVar4 = Reader::get(this_00), (bVar4 & 0xf8) == 0x30) {
        std::__cxx11::string::append((ulong)&str,'\x01');
      }
      if (((byte)(bVar4 - 0x30) < 10 && (bVar4 & 0xfe) == 0x38) ||
         ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)) {
        pHVar20 = (HexBinOctException *)__cxa_allocate_exception(0x28);
        word.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&stack0xffffffffffffffa8;
        std::__cxx11::string::_M_construct((ulong)&word,'\x01');
        HexBinOctException::HexBinOctException(pHVar20,(string *)&word);
        __cxa_throw(pHVar20,&HexBinOctException::typeinfo,SyntaxError::~SyntaxError);
      }
      pNVar18 = (Number *)operator_new(0x50);
      lVar13 = toBase<long,8ul>(&str);
      Number::Number(pNVar18,lVar13);
      std::__shared_ptr<calculator::Number,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Number,void>
                ((__shared_ptr<calculator::Number,(__gnu_cxx::_Lock_policy)2> *)&word,pNVar18);
    }
    else if (cVar7 == 'b') {
      while (bVar4 = Reader::get(this_00), (bVar4 & 0xfe) == 0x30) {
        std::__cxx11::string::append((ulong)&str,'\x01');
      }
      if (((byte)(bVar4 - 0x32) < 8) || ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)) {
        pHVar20 = (HexBinOctException *)__cxa_allocate_exception(0x28);
        word.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&stack0xffffffffffffffa8;
        std::__cxx11::string::_M_construct((ulong)&word,'\x01');
        HexBinOctException::HexBinOctException(pHVar20,(string *)&word);
        __cxa_throw(pHVar20,&HexBinOctException::typeinfo,SyntaxError::~SyntaxError);
      }
      pNVar18 = (Number *)operator_new(0x50);
      lVar13 = toBase<long,2ul>(&str);
      Number::Number(pNVar18,lVar13);
      std::__shared_ptr<calculator::Number,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Number,void>
                ((__shared_ptr<calculator::Number,(__gnu_cxx::_Lock_policy)2> *)&word,pNVar18);
    }
    else {
      pNVar18 = (Number *)operator_new(0x50);
      Number::Number(pNVar18,0);
      std::__shared_ptr<calculator::Number,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Number,void>
                ((__shared_ptr<calculator::Number,(__gnu_cxx::_Lock_policy)2> *)&word,pNVar18);
    }
    std::__shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&num.super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2> *)&word);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&word.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    piVar1 = &(this->reader_).ptr_;
    *piVar1 = *piVar1 + -1;
    std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<calculator::Number,void>
              ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&word,
               &num.super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,&word);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&word.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    psVar3 = &num;
    goto LAB_0010bb4b;
  default:
    if (uVar10 == 0x3c) {
      pVar8 = Reader::geteq(this_00,0x3c);
      if (((ushort)pVar8 & 1) == 0) {
        pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&str,"unexpected <?",(allocator<char> *)&word);
        SyntaxError::SyntaxError(pSVar19,&str);
        __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
      }
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,ShiftLeft);
      std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Token,void>
                ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
      break;
    }
    if (uVar10 == 0x3d) {
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,Equal);
      std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Token,void>
                ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
      break;
    }
    if (uVar10 == 0x3e) {
      pVar8 = Reader::geteq(this_00,0x3e);
      if (((ushort)pVar8 & 1) == 0) {
        pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&str,"unexpected >?",(allocator<char> *)&word);
        SyntaxError::SyntaxError(pSVar19,&str);
        __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
      }
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,ShiftRight);
      std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Token,void>
                ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
      break;
    }
    if (uVar10 == 0x5e) {
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,Xor);
      std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Token,void>
                ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
      break;
    }
    if (uVar10 == 0x7c) {
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,Or);
      std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Token,void>
                ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
      break;
    }
    if (uVar10 == 0x7e) {
      pTVar12 = (Token *)operator_new(0x48);
      Token::Token(pTVar12,Negate);
      std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Token,void>
                ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
      break;
    }
switchD_0010ae1d_caseD_22:
    if (bVar4 == 0x2e || (byte)(bVar4 - 0x30) < 10) {
      str._M_dataplus._M_p = (pointer)&str.field_2;
      str._M_string_length = 0;
      str.field_2._M_local_buf[0] = '\0';
      if (bVar21 != false) {
        std::__cxx11::string::push_back((char)&str);
      }
      if (bVar4 == 0x2e) {
        bVar4 = 0;
        bVar21 = false;
LAB_0010b7d6:
        std::__cxx11::string::append((ulong)&str,'\x01');
        do {
          bVar5 = Reader::get(this_00);
          bVar6 = bVar21;
          if (((bVar5 & 0xdf) == 0x45) && (bVar6 = true, bVar21)) {
            pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&word,"expoent e/E is to many!",(allocator<char> *)&num);
            SyntaxError::SyntaxError(pSVar19,(string *)&word);
            __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
          }
          bVar21 = bVar6;
          if ((bVar5 == 0x2d) || (bVar5 == 0x2b)) {
            uVar10 = (this->reader_).ptr_;
            if (((bool)(bVar4 | (int)uVar10 < 1)) ||
               (bVar4 = 1, (this_00->sbuffer_[(ulong)uVar10 - 1] & 0xdfU) != 0x45))
            goto LAB_0010b87d;
LAB_0010b85b:
            if ((bVar5 != 0x2b) && (bVar5 != 0x2d)) goto LAB_0010b877;
          }
          else if ((byte)(bVar5 - 0x3a) < 0xf6 && (bVar5 & 0xdf) != 0x45) goto LAB_0010b85b;
          std::__cxx11::string::append((ulong)&str,'\x01');
        } while( true );
      }
      bVar6 = false;
      while( true ) {
        bVar5 = (byte)unaff_R15;
        bVar21 = bVar6;
        if (((bVar5 & 0xdf) == 0x45) && (bVar21 = true, bVar6)) {
          pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&word,"expoent e/E is to many!",(allocator<char> *)&num);
          SyntaxError::SyntaxError(pSVar19,(string *)&word);
          __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
        if ((bVar5 == 0x2d) || (((uint)unaff_R15 & 0xff) == 0x2b)) break;
        std::__cxx11::string::append((ulong)&str,'\x01');
        bVar5 = Reader::get(this_00);
        unaff_R15 = (ulong)(uint)bVar5;
        bVar6 = bVar21;
        if ((9 < (byte)(bVar5 - 0x30)) &&
           ((uVar10 = bVar5 - 0x2b, 0x3a < uVar10 ||
            ((0x400000004000005U >> ((ulong)uVar10 & 0x3f) & 1) == 0)))) goto LAB_0010b454;
      }
      lVar13 = (long)(this->reader_).ptr_;
      if ((0 < lVar13) && (bVar4 = 1, (this_00->sbuffer_[lVar13 + -1] & 0xdfU) == 0x45))
      goto LAB_0010b7d6;
LAB_0010b454:
      if (bVar5 == 0x2e) {
        bVar4 = 0;
        goto LAB_0010b7d6;
      }
      if (bVar5 == 0xff) {
        uVar10 = (this->reader_).ptr_;
        if ((bVar21) &&
           (((int)uVar10 < 1 || (9 < (byte)(this_00->sbuffer_[(ulong)uVar10 - 1] - 0x30U))))) {
          pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&word,"after digit e/E errro",(allocator<char> *)&num);
          SyntaxError::SyntaxError(pSVar19,(string *)&word);
          __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
      }
      else {
        uVar10 = (this->reader_).ptr_;
      }
      (this->reader_).ptr_ = uVar10 - 1;
      cVar7 = Reader::cur(this_00);
      this->lookforward_ = cVar7;
      pNVar18 = (Number *)operator_new(0x50);
      dVar22 = toAny<double>(&str);
      Number::Number(pNVar18,(long)dVar22);
      std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<calculator::Number,void>
                ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&word,pNVar18);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,&word);
    }
    else {
      if (0x19 < (byte)((bVar4 & 0xdf) + 0xbf)) {
        if (bVar4 == 0x28) {
          if (this->is_function_ == true) {
            str._M_dataplus._M_p._0_1_ = 1;
            std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                      (&(this->bracket_match_).c,(bool *)&str);
            this->is_function_ = false;
            pTVar12 = (Token *)operator_new(0x48);
            Token::Token(pTVar12,BEGIN_FUNC);
            std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<calculator::Token,void>
                      ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
          }
          else {
            str._M_dataplus._M_p = (pointer)((ulong)str._M_dataplus._M_p._1_7_ << 8);
            std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                      (&(this->bracket_match_).c,(bool *)&str);
            this->is_function_ = false;
            pTVar12 = (Token *)operator_new(0x48);
            Token::Token(pTVar12,BEGIN_BRACKET);
            std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<calculator::Token,void>
                      ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
          }
        }
        else if (uVar10 == 0x29) {
          pbVar16 = (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (pbVar16 ==
              (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur) {
            pSVar19 = (SyntaxError *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&str,"expression unexpected (!",(allocator<char> *)&word);
            SyntaxError::SyntaxError(pSVar19,&str);
            __cxa_throw(pSVar19,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
          }
          if (pbVar16 ==
              (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            pbVar16 = (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
          }
          bVar21 = pbVar16[-1];
          std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->bracket_match_).c);
          this->is_function_ = false;
          if (bVar21 == true) {
            pTVar12 = (Token *)operator_new(0x48);
            Token::Token(pTVar12,END_FUNC);
            std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<calculator::Token,void>
                      ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
          }
          else {
            pTVar12 = (Token *)operator_new(0x48);
            Token::Token(pTVar12,END_BRACKET);
            std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<calculator::Token,void>
                      ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
          }
        }
        else if (uVar10 == 0x3b) {
          psVar2 = (this->tokenlist_).
                   super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (((this->tokenlist_).
               super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
               ._M_impl.super__Vector_impl_data._M_start != psVar2) &&
             (iVar9 = (*(psVar2[-1].
                         super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        _vptr_Token[2])(), iVar9 == 0x13)) {
            return;
          }
          pTVar12 = (Token *)operator_new(0x48);
          Token::Token(pTVar12,END_SEP);
          std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<calculator::Token,void>
                    ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
        }
        else {
          pTVar12 = (Token *)operator_new(0x48);
          Token::Token(pTVar12,bVar4);
          std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<calculator::Token,void>
                    ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&str,pTVar12);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&str);
        }
        break;
      }
      str._M_dataplus._M_p = (pointer)&str.field_2;
      str._M_string_length = 0;
      str.field_2._M_local_buf[0] = '\0';
      do {
        std::__cxx11::string::append((ulong)&str,'\x01');
        bVar4 = Reader::get(this_00);
      } while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a);
      while ((byte)(bVar4 - 0x30) < 10) {
        std::__cxx11::string::append((ulong)&str,'\x01');
        bVar4 = Reader::get(this_00);
      }
      if (bVar4 == 0x28) {
        bVar6 = isUnaryFunction(this,&str);
        if (bVar6) {
          piVar1 = &(this->reader_).ptr_;
          *piVar1 = *piVar1 + -1;
          this->is_function_ = true;
          this_01 = (Function *)operator_new(0x70);
          Function::Function(this_01,&str,bVar21);
          std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<calculator::Function,void>
                    ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&word,this_01);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,&word);
        }
        else {
          bVar6 = isBinaryFunction(this,&str);
          if (!bVar6) {
            this_06 = (FunctionNotDefined *)__cxa_allocate_exception(0x28);
            FunctionNotDefined::FunctionNotDefined(this_06,&str);
            __cxa_throw(this_06,&FunctionNotDefined::typeinfo,SyntaxError::~SyntaxError);
          }
          piVar1 = &(this->reader_).ptr_;
          *piVar1 = *piVar1 + -1;
          this->is_function_ = true;
          this_02 = (BinaryFunction *)operator_new(0x70);
          BinaryFunction::BinaryFunction(this_02,&str,bVar21);
          std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<calculator::BinaryFunction,void>
                    ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&word,this_02);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,&word);
        }
      }
      else {
        piVar1 = &(this->reader_).ptr_;
        *piVar1 = *piVar1 + -1;
        iVar14 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->variable)._M_h,&str);
        if (iVar14.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          this_03 = (Word *)operator_new(0x70);
          Word::Word(this_03,&str,bVar21,Identifier);
          std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<calculator::Word,void>
                    ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&word,this_03);
          this_04 = &std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&this->variable,&str)->
                     super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (this_04,&word.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>
                    );
          std::
          vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
          ::push_back(&this->tokenlist_,
                      (value_type *)
                      &word.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>);
        }
        else {
          if (bVar21 != false) {
            pNVar18 = (Number *)operator_new(0x50);
            Number::Number(pNVar18,-1);
            std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<calculator::Number,void>
                      ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&word,pNVar18);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,&word);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&word.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            pTVar12 = (Token *)operator_new(0x48);
            Token::Token(pTVar12,Mul);
            std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<calculator::Token,void>
                      ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&word,pTVar12);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,&word);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&word.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          iVar15 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this,(key_type *)
                                  ((long)iVar14.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
                                         ._M_cur + 8));
          if (iVar15.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::
            vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
            ::push_back(&this->tokenlist_,
                        (value_type *)
                        ((long)iVar14.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
                               ._M_cur + 0x28));
            goto LAB_0010bb50;
          }
          pFVar17 = (Float *)operator_new(0x50);
          Float::Float(pFVar17,*(double *)
                                ((long)iVar15.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                                       ._M_cur + 0x28));
          std::__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<calculator::Float,void>
                    ((__shared_ptr<calculator::Token,(__gnu_cxx::_Lock_policy)2> *)&word,pFVar17);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,&word);
        }
      }
    }
LAB_0010bb46:
    psVar3 = (shared_ptr<calculator::Number> *)&word;
LAB_0010bb4b:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(psVar3->super___shared_ptr<calculator::Number,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
LAB_0010bb50:
    std::__cxx11::string::~string((string *)&str);
    return;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str._M_string_length);
  return;
}

Assistant:

void Lexer::scan() {
    char c;
    // 标志是否为负数
    bool minus = false;
    // 跳过空白字符
    while (!reader_.eof()) {
        c = reader_.get();
        if (c == EOF) return;
        if (isspace(c))
            continue;
        else if (isnewline_(c))
            line_++;
        else if (c == '+' || c == '-') {
            char nc;
            // 判断是否出现多个连续的 +-符号
            while (isspace((nc = reader_.get())))
                ;
            if (c == nc) {
                throw SyntaxError("can not present continue symbol ++/--");
            } else {
                reader_.back();
                break;
            }
        } else
            break;
    }

    // )+   )- 向前看字符如果是 ) 说明当前的 +/- 一定是一个 减法或加法
    if (lookforward_ != ')' && !isexponent(lookforward_) &&
        (c == '-' || c == '+')) {
        // +100 / -100  0.+100
        // 对于表达式 1 + -100 和 1. - 100 可以识别出来
        if (!isdigit(lookforward_) && !isletter(lookforward_) &&
            lookforward_ != '.') {
            if (c == '-') minus = true;
            c = reader_.get();
            while (isspace(c)) c = reader_.get();
        }
    }
    // 保存前一个字符
    lookforward_ = c;

    switch (c) {
        case '&':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::And)));
        case '|':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Or)));
        case '!':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Not)));
        case '^':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Xor)));
        case '~':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Negate)));
        case '+':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Add)));
        case '-': {
            // -表示一个负数，而非减法
            if (minus) break;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Sub)));
        }
        case '*': {
            if (auto [ok, c] = reader_.geteq('*'); ok) {
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::Pow)));
            } else {
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::Mul)));
            }
        }
        case '/':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Div)));
        case '=':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Equal)));
        case '%':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Mod)));
        case '<': {
            // <<左移
            if (auto [ok, c] = reader_.geteq('<'); ok)
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::ShiftLeft)));
            else
                throw SyntaxError("unexpected <?");
        } break;
        case '>': {
            // >>右移
            if (auto [ok, c] = reader_.geteq('>'); ok)
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::ShiftRight)));
            else
                throw SyntaxError("unexpected >?");
        }
        default:
            break;
    }
    /*
     * 处理进制数
     * 十六进制: 0xabcdef
     * 八进制:  0o1234567
     * 二进制:  0b1010101
     */
    if (c == '0') {
        // 处理小数
        if (reader_.peek() == '.') goto __integer_float_number_state;
        // 整数第一个数不能为0
        if (isdigit(reader_.peek()))
            throw ZeroNumberException(reader_.peek() - '0');

        c = reader_.get();
        std::string str;
        // 将非十进制的数字转化为十进制整数
        std::shared_ptr<Number> num = nullptr;

        // 判断下一个字符是否表示进制
        switch (c) {
            case 'x': {
                c = reader_.get();
                while (ishex(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if (isletter(c) && (c > 'f' || c > 'F'))
                    throw HexBinOctException(std::string(1, c));

                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 16>(str)));
            } break;
            case 'o': {
                c = reader_.get();
                while (isoct(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if ((isdigit(c) && (c > '7' && c <= '9')) || isletter(c))
                    throw HexBinOctException(std::string(1, c));
                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 8>(str)));
            } break;
            case 'b':
                c = reader_.get();
                while (isbin(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if ((isdigit(c) && (c > '1' && c <= '9')) || isletter(c))
                    throw HexBinOctException(std::string(1, c));
                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 2>(str)));
                break;
            default:
                // 单独的整数0
                num = std::shared_ptr<Number>(new Number(0));
        }
        // 回退一个字符
        reader_.back();
        return tokenlist_.push_back(num);
    }

__integer_float_number_state:
    // 整数或浮点数
    if (isdigit(c) || c == '.') {
        std::string s;
        bool once_add_sub = false, once_exponent = false;
        if (minus) s += '-';
        if (c == '.') goto __float_state;
        do {
            if (isexponent(c)) {
                if (once_exponent) throw SyntaxError("expoent e/E is to many!");
                once_exponent = true;
            }
            // e/E+/-/数字
            if (c == '-' || c == '+') {
                // 只能出现一次e/E+/-
                if (isexponent(reader_.backc())) {
                    once_add_sub = true;
                    goto __float_state;
                } else
                    break;
            }
            s.append(1, c);
            c = reader_.get();
        } while (isdigit(c) || isexponent(c) || c == '-' || c == '+');
        if (c != '.') {
            // 读取到最后一个字符，但是数字后面存在一个E
            if (c == EOF) {
                if (once_exponent && !isdigit(reader_.backc()))
                    throw SyntaxError("after digit e/E errro");
            }
            reader_.back();
            lookforward_ = reader_.cur();
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Number(toAny<double>(s))));
        }
    __float_state:
        // 添加小数点
        s.append(1, c);
        for (;;) {
            c = reader_.get();
            if (isexponent(c)) {
                if (once_exponent) throw SyntaxError("expoent e/E is to many!");
                once_exponent = true;
            }
            if (c == '+' || c == '-') {
                // 再次出现 +/- 时就表示加减法
                if (once_add_sub) break;
                once_add_sub = true;
                // 只能在e/E后面出现一次+/-
                if (!isexponent(reader_.backc())) break;
            }
            if (!isdigit(c) && !isexponent(c) && c != '+' && c != '-') break;
            s.append(1, c);
        }
        reader_.back();
        lookforward_ = reader_.cur();
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Float(toAny<double>(s))));
    }
    // 变量名/函数名 可以是字母和数字的组合
    if (isletter(c)) {
        std::string b;
        // 字母
        do {
            b.append(1, c);
            c = reader_.get();
        } while (isletter(c));
        // 数字
        while (isdigit(c)) {
            b.append(1, c);
            c = reader_.get();
        }
        // 如果变量名表示的是一个函数名(查表)
        if (c == '(') {
            if (isUnaryFunction(b)) {
                reader_.back();
                is_function_ = true;
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Function(b, minus)));
            } else if (isBinaryFunction(b)) {
                reader_.back();
                is_function_ = true;
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new BinaryFunction(b, minus)));
            } else
                throw FunctionNotDefined(b);
        } else {
            // 回退一个位置，因为还需要将 (
            // 作为token保存下来(目的是后续判断当前变量名是否是一个函数名)
            reader_.back();
            // 变量名不存在，则保存到变量表中。注意，函数名不需要保存到表中！！！
            if (auto it = variable.find(b); it == variable.end()) {
                auto word = std::shared_ptr<Token>(new Word(b, minus));
                variable[b] = word;
                return tokenlist_.push_back(word);
            } else {
                // 变量/常量附带一个负号标志
                // 比如 a=100;b=-a / -pi
                // 这里处理方法是将 -a 看作 -1 * a
                if (minus) {
                    tokenlist_.push_back(
                        std::shared_ptr<Token>(new Number(-1)));
                    tokenlist_.push_back(
                        std::shared_ptr<Token>(new Token(Tag::Mul)));
                }
                // 如果变量存在常量表中，那么就直接将这个变量替换为对应的常量值
                if (auto x = constant.find(it->first); x != constant.end()) {
                    return tokenlist_.push_back(
                        std::shared_ptr<Token>(new Float(x->second)));
                }
                // 否则直接返回表中变量名
                return tokenlist_.push_back(it->second);
            }
        }
        // 变量声明的分隔符;
    } else if (c == ';') {
        // ; ; 过滤多个连续的分隔符
        if (!tokenlist_.empty() && tokenlist_.back()->type() == Tag::END_SEP)
            return;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::END_SEP)));

    } else if (c == '(') {
        // 函数的开始标志符 (
        if (is_function_) {
            bracket_match_.push(true);
            is_function_ = false;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::BEGIN_FUNC)));
        }
        // 普通的左括号
        bracket_match_.push(false);
        is_function_ = false;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::BEGIN_BRACKET)));

    } else if (c == ')') {
        // 如果栈为空，说明括号不匹配
        if (bracket_match_.empty())
            throw SyntaxError("expression unexpected (!");

        // 函数的结尾标识符 )
        bool isEndOfFunction = bracket_match_.top();
        bracket_match_.pop();
        if (isEndOfFunction) {
            is_function_ = false;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::END_FUNC)));
        }
        // 普通的右括号
        is_function_ = false;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::END_BRACKET)));
    }
    // 根据其字符来指定其token，比如二元函数的分隔符号,
    return tokenlist_.push_back(std::shared_ptr<Token>(new Token(c)));
}